

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

void __thiscall amrex::BARef::define(BARef *this,istream *is,int *ndims)

{
  pointer pBVar1;
  _Ios_Seekdir _Var2;
  int iVar3;
  istream *this_00;
  ulong *puVar4;
  istream *piVar5;
  pointer b;
  char c2;
  char c1;
  int itmp;
  int maxbox;
  ULong tmphash;
  
  this_00 = (istream *)std::istream::ignore((long)is,100000);
  puVar4 = (ulong *)std::istream::operator>>(this_00,&maxbox);
  std::istream::_M_extract<unsigned_long>(puVar4);
  resize(this,(long)maxbox);
  _Var2 = std::istream::tellg();
  *ndims = 3;
  piVar5 = std::ws<char,std::char_traits<char>>(is);
  piVar5 = std::operator>>(piVar5,&c1);
  piVar5 = std::ws<char,std::char_traits<char>>(piVar5);
  std::operator>>(piVar5,&c2);
  if ((c1 == '(') && (c2 == '(')) {
    std::istream::operator>>((istream *)is,&itmp);
    *ndims = 1;
    std::ws<char,std::char_traits<char>>(is);
    iVar3 = std::istream::peek();
    if (iVar3 == 0x2c) {
      std::istream::ignore((long)is,100000);
      std::istream::operator>>((istream *)is,&itmp);
      *ndims = *ndims + 1;
      std::ws<char,std::char_traits<char>>(is);
      iVar3 = std::istream::peek();
      if (iVar3 == 0x2c) {
        *ndims = *ndims + 1;
      }
    }
  }
  std::istream::seekg((long)is,_Var2);
  pBVar1 = (this->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (b = (this->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_start; b != pBVar1; b = b + 1) {
    amrex::operator>>(is,b);
  }
  std::istream::ignore((long)is,100000);
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) != 0) {
    Error_host("BoxArray::define(istream&) failed");
  }
  return;
}

Assistant:

void
BARef::define (std::istream& is, int& ndims)
{
    //
    // TODO -- completely remove the fiction of a hash value.
    //
    BL_ASSERT(m_abox.size() == 0);
    int   maxbox;
    ULong tmphash;
    is.ignore(bl_ignore_max, '(') >> maxbox >> tmphash;
    resize(maxbox);
    auto pos = is.tellg();
    {
        ndims = AMREX_SPACEDIM;
        char c1, c2;
        int itmp;
        is >> std::ws >> c1 >> std::ws >> c2;
        if (c1 == '(' && c2 == '(') {
            is >> itmp;
            ndims = 1;
#if (AMREX_SPACEDIM >= 2)
            is >> std::ws;
            int ic = is.peek();
            if (ic == static_cast<int>(',')) {
                is.ignore(BL_IGNORE_MAX, ',');
                is >> itmp;
                ++ndims;
#if (AMREX_SPACEDIM == 3)
                is >> std::ws;
                ic = is.peek();
                if (ic == static_cast<int>(',')) {
                    ++ndims;
                }
#endif
            }
#endif
        }
    }
    is.seekg(pos, std::ios_base::beg);
    for (Vector<Box>::iterator it = m_abox.begin(), End = m_abox.end(); it != End; ++it)
        is >> *it;
    is.ignore(bl_ignore_max, ')');
    if (is.fail())
        amrex::Error("BoxArray::define(istream&) failed");
}